

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxu8 randomByte(SyPRNGCtx *pCtx)

{
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  
  bVar2 = pCtx->i + 1;
  pCtx->i = bVar2;
  uVar1 = pCtx->s[bVar2];
  bVar3 = pCtx->j + uVar1;
  pCtx->j = bVar3;
  pCtx->s[bVar2] = pCtx->s[bVar3];
  pCtx->s[bVar3] = uVar1;
  return pCtx->s[(byte)(uVar1 + pCtx->s[bVar2])];
}

Assistant:

static sxu8 randomByte(SyPRNGCtx *pCtx)
{
  sxu8 t;
  
  /* Generate and return single random byte */
  pCtx->i++;
  t = pCtx->s[pCtx->i];
  pCtx->j += t;
  pCtx->s[pCtx->i] = pCtx->s[pCtx->j];
  pCtx->s[pCtx->j] = t;
  t += pCtx->s[pCtx->i];
  return pCtx->s[t];
}